

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall
SBarInfoCommandFlowControl::ParseBlock
          (SBarInfoCommandFlowControl *this,
          TDeletingArray<SBarInfoCommand_*,_SBarInfoCommand_*> *commands,FScanner *sc,
          bool fullScreenOffsets)

{
  bool bVar1;
  SBarInfoCommand *cmd;
  
  bVar1 = FScanner::CheckToken(sc,0x7b);
  if (bVar1) {
    while( true ) {
      cmd = NextCommand(this,sc);
      if (cmd == (SBarInfoCommand *)0x0) break;
      (*cmd->_vptr_SBarInfoCommand[3])(cmd,sc,(ulong)fullScreenOffsets);
      TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::Push
                (&commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>,&cmd);
    }
  }
  else {
    cmd = NextCommand(this,sc);
    if (cmd == (SBarInfoCommand *)0x0) {
      FScanner::ScriptError(sc,"Missing command for flow control statement.");
    }
    else {
      (*cmd->_vptr_SBarInfoCommand[3])(cmd,sc,(ulong)fullScreenOffsets);
      TArray<SBarInfoCommand_*,_SBarInfoCommand_*>::Push
                (&commands->super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>,&cmd);
    }
  }
  return;
}

Assistant:

void ParseBlock(TDeletingArray<SBarInfoCommand *> &commands, FScanner &sc, bool fullScreenOffsets)
		{
			if(sc.CheckToken('{'))
			{
				while(SBarInfoCommand *cmd = NextCommand(sc))
				{
					cmd->Parse(sc, fullScreenOffsets);
					commands.Push(cmd);
				}
			}
			else
			{
				if(SBarInfoCommand *cmd = NextCommand(sc))
				{
					cmd->Parse(sc, fullScreenOffsets);
					commands.Push(cmd);
				}
				else
					sc.ScriptError("Missing command for flow control statement.");
			}
		}